

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  bool bVar4;
  string local_name;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  pcVar1 = (this->name_)._M_dataplus._M_p;
  local_48 = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->name_)._M_string_length);
  if (this->ignore_case_ == true) {
    pcVar1 = (this->name_)._M_dataplus._M_p;
    local_88 = local_78;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + (this->name_)._M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_88,local_88 + local_80,local_88);
    if (local_88 == local_78) {
      uStack_50 = uStack_70;
      local_68 = local_58;
    }
    else {
      local_68 = local_88;
    }
    local_60 = local_80;
    local_80 = 0;
    local_78[0] = 0;
    local_88 = local_78;
    ::std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    pcVar1 = (name_to_check->_M_dataplus)._M_p;
    local_a8 = local_98;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,pcVar1 + name_to_check->_M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_a8,local_a8 + local_a0,local_a8);
    if (local_a8 == local_98) {
      uStack_50 = uStack_90;
      local_68 = local_58;
    }
    else {
      local_68 = local_a8;
    }
    local_60 = local_a0;
    local_a0 = 0;
    local_98[0] = 0;
    local_a8 = local_98;
    ::std::__cxx11::string::operator=((string *)name_to_check,(string *)&local_68);
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8);
    }
  }
  puVar2 = local_48;
  if (local_40 == name_to_check->_M_string_length) {
    if (local_40 == 0) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp(local_48,(name_to_check->_M_dataplus)._M_p,local_40);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (puVar2 != local_38) {
    operator_delete(puVar2);
  }
  return bVar4;
}

Assistant:

bool check_name(std::string name_to_check) const {
        std::string local_name = name_;
        if(ignore_case_) {
            local_name = detail::to_lower(name_);
            name_to_check = detail::to_lower(name_to_check);
        }

        return local_name == name_to_check;
    }